

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O1

void write_other_cert(scep *s)

{
  ulong uVar1;
  int iVar2;
  X509_NAME *pXVar3;
  char *pcVar4;
  FILE *pFVar5;
  FILE *fp;
  BIO *bp;
  PKCS7 *pPVar6;
  X509 *pXVar7;
  X509_EXTENSION *pXVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  X509 *unaff_RBP;
  long lVar12;
  char *pcVar13;
  char *unaff_R12;
  uint uVar14;
  ulong unaff_R13;
  FILE *unaff_R14;
  ulong uVar15;
  char **ppcVar16;
  char buffer [1024];
  uint uStack_cdc;
  PKCS7 *pPStack_cd8;
  BIO *pBStack_cd0;
  long lStack_cc8;
  byte abStack_cc0 [64];
  char acStack_c80 [1024];
  char acStack_880 [1032];
  X509 *pXStack_478;
  char *pcStack_470;
  ulong uStack_468;
  FILE *pFStack_460;
  FILE *pFStack_458;
  X509 *pXStack_450;
  scep *local_440;
  FILE local_438 [4];
  
  ppcVar16 = (char **)((s->reply_p7->d).data)->flags;
  pXStack_450 = (X509 *)0x10dd6e;
  pFVar5 = (FILE *)ppcVar16;
  local_440 = s;
  iVar2 = OPENSSL_sk_num();
  pXVar7 = (X509 *)0x0;
  if (0 < iVar2) {
    unaff_R13 = 0;
    do {
      pXStack_450 = (X509 *)0x10dd86;
      unaff_RBP = (X509 *)OPENSSL_sk_value(ppcVar16,unaff_R13);
      pcVar13 = pname;
      if (v_flag != 0) {
        pXStack_450 = (X509 *)0x10dda7;
        pXVar3 = X509_get_subject_name(unaff_RBP);
        unaff_R14 = local_438;
        pXStack_450 = (X509 *)0x10ddbc;
        pcVar4 = X509_NAME_oneline(pXVar3,(char *)unaff_R14,0x400);
        pXStack_450 = (X509 *)0x10ddd0;
        printf("%s: found certificate with\n  subject: %s\n",pcVar13,pcVar4);
        pXStack_450 = (X509 *)0x10ddd8;
        pXVar3 = X509_get_issuer_name(unaff_RBP);
        pXStack_450 = (X509 *)0x10dde8;
        pcVar4 = X509_NAME_oneline(pXVar3,(char *)unaff_R14,0x400);
        pXStack_450 = (X509 *)0x10ddf9;
        printf("  issuer: %s\n",pcVar4);
        unaff_R12 = pcVar13;
      }
      pXStack_450 = (X509 *)0x10de01;
      pFVar5 = (FILE *)X509_get_serialNumber(unaff_RBP);
      pXStack_450 = (X509 *)0x10de19;
      iVar2 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pFVar5,(ASN1_INTEGER *)local_440->ias_getcert->serial
                              );
      pXVar7 = unaff_RBP;
      if (iVar2 == 0) break;
      uVar14 = (int)unaff_R13 + 1;
      unaff_R13 = (ulong)uVar14;
      pXStack_450 = (X509 *)0x10de2c;
      pFVar5 = (FILE *)ppcVar16;
      iVar2 = OPENSSL_sk_num();
      pXVar7 = (X509 *)0x0;
    } while ((int)uVar14 < iVar2);
  }
  if (pXVar7 == (X509 *)0x0) {
    pXStack_450 = (X509 *)0x10ded0;
    write_other_cert_cold_3();
  }
  else {
    ppcVar16 = &w_char;
    pXStack_450 = (X509 *)0x10de54;
    pFVar5 = (FILE *)w_char;
    fp = fopen(w_char,"w");
    if (fp != (FILE *)0x0) {
      if (v_flag != 0) {
        pXStack_450 = (X509 *)0x10de83;
        printf("%s: certificate written as %s\n",pname,w_char);
      }
      if (d_flag != 0) {
        pXStack_450 = (X509 *)0x10dea1;
        PEM_write_X509(_stdout,pXVar7);
      }
      pXStack_450 = (X509 *)0x10deac;
      pFVar5 = fp;
      iVar2 = PEM_write_X509(fp,pXVar7);
      unaff_R14 = fp;
      if (iVar2 == 1) {
        pXStack_450 = (X509 *)0x10deb9;
        fclose(fp);
        return;
      }
      goto LAB_0010ded5;
    }
  }
  pXStack_450 = (X509 *)0x10ded5;
  write_other_cert_cold_2();
LAB_0010ded5:
  pXStack_450 = (X509 *)write_ca_ra;
  write_other_cert_cold_1();
  pXStack_478 = pXVar7;
  pcStack_470 = unaff_R12;
  uStack_468 = unaff_R13;
  pFStack_460 = unaff_R14;
  pFStack_458 = (FILE *)ppcVar16;
  pXStack_450 = unaff_RBP;
  bp = BIO_new_mem_buf(pFVar5->_IO_read_end,*(int *)&pFVar5->_IO_read_base);
  pPVar6 = d2i_PKCS7_bio(bp,(PKCS7 **)0x0);
  if (pPVar6 == (PKCS7 *)0x0) {
    pcVar13 = "%s: error reading PKCS#7 data\n";
LAB_0010df27:
    fprintf(_stderr,pcVar13,pname);
LAB_0010df31:
    ERR_print_errors_fp(_stderr);
  }
  else {
    iVar2 = OBJ_obj2nid(pPVar6->type);
    if (iVar2 == 0x16) {
      lVar12 = ((pPVar6->d).data)->flags;
      if (lVar12 != 0) {
        pPStack_cd8 = pPVar6;
        pBStack_cd0 = bp;
        iVar2 = OPENSSL_sk_num(lVar12);
        if (0 < iVar2) {
          uVar15 = 0;
          lStack_cc8 = lVar12;
          do {
            memset(acStack_c80,0,0x400);
            memset(acStack_880,0,0x400);
            pXVar7 = (X509 *)OPENSSL_sk_value(lVar12,uVar15);
            snprintf(acStack_880,0x400,"%s-%d",c_char,uVar15);
            pcVar13 = pname;
            if (v_flag != 0) {
              pXVar3 = X509_get_subject_name(pXVar7);
              pcVar4 = X509_NAME_oneline(pXVar3,acStack_c80,0x400);
              printf("\n%s: found certificate with\n  subject: %s\n",pcVar13,pcVar4);
            }
            if (v_flag != 0) {
              pXVar3 = X509_get_issuer_name(pXVar7);
              pcVar13 = X509_NAME_oneline(pXVar3,acStack_c80,0x400);
              printf("  issuer: %s\n",pcVar13);
            }
            iVar2 = X509_digest(pXVar7,(EVP_MD *)fp_alg,abStack_cc0,&uStack_cdc);
            if (iVar2 == 0) goto LAB_0010df31;
            iVar2 = X509_get_ext_by_NID(pXVar7,0x57,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  basic constraints: (not included)");
              }
            }
            else {
              pXVar8 = X509_get_ext(pXVar7,iVar2);
              if (v_flag != 0) {
                printf("  basic constraints: ");
                X509V3_EXT_print_fp(_stdout,pXVar8,0,0);
                putchar(10);
              }
            }
            iVar2 = X509_get_ext_by_NID(pXVar7,0x53,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  usage: (not included)");
              }
            }
            else {
              pXVar8 = X509_get_ext(pXVar7,iVar2);
              if (v_flag != 0) {
                printf("  usage: ");
                X509V3_EXT_print_fp(_stdout,pXVar8,0,0);
                putchar(10);
              }
            }
            if (v_flag != 0) {
              iVar2 = EVP_MD_get_type(fp_alg);
              pcVar13 = OBJ_nid2sn(iVar2);
              printf("  %s fingerprint: ",pcVar13);
              uVar10 = (ulong)uStack_cdc;
              if (0 < (int)uStack_cdc) {
                uVar9 = 0;
                do {
                  uVar1 = uVar9 + 1;
                  uVar11 = 10;
                  if (uVar1 != (uVar10 & 0xffffffff)) {
                    uVar11 = 0x3a;
                  }
                  printf("%02X%c",(ulong)abStack_cc0[uVar9],uVar11);
                  uVar10 = (ulong)(int)uStack_cdc;
                  uVar9 = uVar1;
                } while ((long)uVar1 < (long)uVar10);
              }
            }
            pFVar5 = fopen(acStack_880,"w");
            if (pFVar5 == (FILE *)0x0) {
              pcVar13 = "%s: cannot open cert file for writing\n";
              goto LAB_0010df71;
            }
            if (v_flag != 0) {
              printf("%s: certificate written as %s\n",pname,acStack_880);
            }
            if (d_flag != 0) {
              PEM_write_X509(_stdout,pXVar7);
            }
            iVar2 = PEM_write_X509(pFVar5,pXVar7);
            if (iVar2 != 1) {
              pcVar13 = "%s: error while writing certificate file\n";
              goto LAB_0010df27;
            }
            fclose(pFVar5);
            lVar12 = lStack_cc8;
            uVar14 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar14;
            iVar2 = OPENSSL_sk_num(lStack_cc8);
          } while ((int)uVar14 < iVar2);
        }
        PKCS7_free(pPStack_cd8);
        BIO_free(pBStack_cd0);
        exit(0);
      }
      pcVar13 = "%s: cannot find certificates\n";
LAB_0010df71:
      fprintf(_stderr,pcVar13,pname);
    }
    else {
      printf("%s: wrong PKCS#7 type\n",pname);
    }
  }
  exit(0x5d);
}

Assistant:

void
write_other_cert(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509)		*certs;
	X509			*cert = NULL;
	FILE			*fp;
	int			i;
	X509 *othercert = NULL;

	/* Get certs */
	p7 = s->reply_p7;
	certs = p7->d.sign->cert;
	
	/* Find cert */
	for (i = 0; i < sk_X509_num(certs); i++) {
		char buffer[1024];

		cert = sk_X509_value(certs, i);
		if (v_flag) {
			printf("%s: found certificate with\n"
				"  subject: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(cert),
					buffer, sizeof(buffer)));
			printf("  issuer: %s\n", 
				X509_NAME_oneline(X509_get_issuer_name(cert),
					buffer, sizeof(buffer)));
		}
		/* The serial has to match to requested one */
		if (!ASN1_INTEGER_cmp(X509_get_serialNumber(cert),
				s->ias_getcert->serial)) {
				othercert = cert;	
				break;
		}	
	}
	if (othercert == NULL) {
		fprintf(stderr, "%s: cannot find certificate\n", pname);
		exit (SCEP_PKISTATUS_FILE);

	}
	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, w_char, "w")))
#else
	if (!(fp = fopen(w_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open cert file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: certificate written as %s\n", pname, w_char);
	if (d_flag)
		PEM_write_X509(stdout, othercert);
	if (PEM_write_X509(fp, othercert) != 1) {
		fprintf(stderr, "%s: error while writing certificate "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	(void)fclose(fp);
}